

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::AppendStringFallback
          (EpsCopyInputStream *this,char *ptr,int size,string *str)

{
  LogMessage *other;
  int iVar1;
  pair<const_char_*,_bool> pVar2;
  LogMessage local_70;
  int local_38;
  LogFinisher local_31;
  
  if ((long)size <= (long)(this->buffer_end_ + ((long)this->limit_ - (long)ptr))) {
    std::__cxx11::string::reserve((ulong)str);
  }
  iVar1 = (*(int *)&this->buffer_end_ - (int)ptr) + 0x10;
  do {
    if (size <= iVar1) {
      local_38 = size;
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/parse_context.h"
                 ,0x12a);
      other = LogMessage::operator<<(&local_70,"CHECK failed: size > chunk_size: ");
      LogFinisher::operator=(&local_31,other);
      LogMessage::~LogMessage(&local_70);
      size = local_38;
    }
    size = size - iVar1;
    std::__cxx11::string::append((char *)str,(ulong)ptr);
    if (this->limit_ == 0x10) {
      return (char *)0x0;
    }
    pVar2 = DoneFallback(this,ptr + iVar1,-1);
    ptr = pVar2.first;
    if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      return (char *)0x0;
    }
    iVar1 = (*(int *)&this->buffer_end_ - (int)pVar2.first) + 0x10;
  } while (iVar1 < size);
  std::__cxx11::string::append((char *)str,(ulong)ptr);
  return ptr + size;
}

Assistant:

const char* EpsCopyInputStream::AppendStringFallback(const char* ptr, int size,
                                                     std::string* str) {
  if (PROTOBUF_PREDICT_TRUE(size <= buffer_end_ - ptr + limit_)) {
    // Reserve the string up to a static safe size. If strings are bigger than
    // this we proceed by growing the string as needed. This protects against
    // malicious payloads making protobuf hold on to a lot of memory.
    str->reserve(str->size() + std::min<int>(size, kSafeStringSize));
  }
  return AppendSize(ptr, size,
                    [str](const char* p, int s) { str->append(p, s); });
}